

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnTableCopyExpr
          (ExprVisitorDelegate *this,TableCopyExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *s;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::TableCopy_Opcode);
  WritePutsSpace(this_00,s);
  bVar1 = VarIsZero(&expr->dst_table);
  if (bVar1) {
    bVar1 = VarIsZero(&expr->src_table);
    if (bVar1) goto LAB_0013ab04;
  }
  WriteVar(this->writer_,&expr->dst_table,Space);
  WriteVar(this->writer_,&expr->src_table,Space);
LAB_0013ab04:
  WriteNewline(this->writer_,false);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTableCopyExpr(TableCopyExpr* expr) {
  writer_->WritePutsSpace(Opcode::TableCopy_Opcode.GetName());
  if (!(VarIsZero(expr->dst_table) && VarIsZero(expr->src_table))) {
    writer_->WriteVar(expr->dst_table, NextChar::Space);
    writer_->WriteVar(expr->src_table, NextChar::Space);
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}